

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O3

OptionalStorage<llvm::DWARFDebugRnglistTable,_false> * __thiscall
llvm::optional_detail::OptionalStorage<llvm::DWARFDebugRnglistTable,_false>::operator=
          (OptionalStorage<llvm::DWARFDebugRnglistTable,_false> *this,DWARFDebugRnglistTable *y)

{
  map<unsigned_long,_llvm::DWARFDebugRnglist,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
  *this_00;
  map<unsigned_long,_llvm::DWARFDebugRnglist,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
  *__x;
  bool bVar1;
  uint64_t uVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  anon_union_152_2_fc7899a5_for_OptionalStorage<llvm::DWARFDebugRnglistTable,_false>_2 *paVar7;
  uint16_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint32_t uVar11;
  undefined7 uVar12;
  DwarfFormat DVar13;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  
  bVar1 = this->hasVal;
  uVar8 = (y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).Header.HeaderData.Version;
  uVar9 = (y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).Header.HeaderData.AddrSize;
  uVar10 = (y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).Header.HeaderData.SegSize;
  uVar11 = (y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).Header.HeaderData.OffsetEntryCount
  ;
  (this->field_0).value.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.Length =
       (y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).Header.HeaderData.Length;
  paVar7 = &this->field_0;
  (((DWARFListTableBase<llvm::DWARFDebugRnglist> *)paVar7)->Header).HeaderData.Version = uVar8;
  (((DWARFListTableBase<llvm::DWARFDebugRnglist> *)paVar7)->Header).HeaderData.AddrSize = uVar9;
  (((DWARFListTableBase<llvm::DWARFDebugRnglist> *)paVar7)->Header).HeaderData.SegSize = uVar10;
  (((DWARFListTableBase<llvm::DWARFDebugRnglist> *)paVar7)->Header).HeaderData.OffsetEntryCount =
       uVar11;
  this_01 = &(this->field_0).value.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets;
  __x_00 = &(y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).Header.Offsets;
  this_00 = &(this->field_0).value.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap;
  __x = &(y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).ListMap;
  if (bVar1 == true) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(this_01,__x_00);
    uVar12 = *(undefined7 *)
              &(y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).Header.field_0x29;
    uVar2 = (y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).Header.HeaderOffset;
    pcVar3 = (y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).Header.SectionName.Data;
    sVar4 = (y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).Header.SectionName.Length;
    pcVar5 = (y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).Header.ListTypeString.Data;
    sVar6 = (y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).Header.ListTypeString.Length;
    *(DwarfFormat *)((long)&this->field_0 + 0x28) =
         (y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).Header.Format;
    *(undefined7 *)((long)&this->field_0 + 0x29) = uVar12;
    (this->field_0).value.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderOffset =
         uVar2;
    (this->field_0).value.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.SectionName.Data
         = pcVar3;
    (this->field_0).value.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.SectionName.
    Length = sVar4;
    (this->field_0).value.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.ListTypeString.
    Data = pcVar5;
    (this->field_0).value.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.ListTypeString.
    Length = sVar6;
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
    ::operator=(&this_00->_M_t,&__x->_M_t);
    sVar4 = (y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).HeaderString.Length;
    (this->field_0).value.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.Data =
         (y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).HeaderString.Data;
    (this->field_0).value.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.Length =
         sVar4;
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(this_01,__x_00);
    DVar13 = (y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).Header.Format;
    uVar12 = *(undefined7 *)
              &(y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).Header.field_0x29;
    uVar2 = (y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).Header.HeaderOffset;
    pcVar3 = (y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).Header.SectionName.Data;
    sVar4 = (y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).Header.SectionName.Length;
    sVar6 = (y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).Header.ListTypeString.Length;
    (this->field_0).value.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.ListTypeString.
    Data = (y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).Header.ListTypeString.Data;
    (this->field_0).value.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.ListTypeString.
    Length = sVar6;
    (this->field_0).value.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.SectionName.Data
         = pcVar3;
    (this->field_0).value.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.SectionName.
    Length = sVar4;
    *(DwarfFormat *)((long)&this->field_0 + 0x28) = DVar13;
    *(undefined7 *)((long)&this->field_0 + 0x29) = uVar12;
    (this->field_0).value.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderOffset =
         uVar2;
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
    ::_Rb_tree(&this_00->_M_t,&__x->_M_t);
    sVar4 = (y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).HeaderString.Length;
    (this->field_0).value.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.Data =
         (y->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).HeaderString.Data;
    (this->field_0).value.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.Length =
         sVar4;
    this->hasVal = true;
  }
  return this;
}

Assistant:

OptionalStorage &operator=(T const &y) {
    if (hasValue()) {
      value = y;
    } else {
      ::new ((void *)std::addressof(value)) T(y);
      hasVal = true;
    }
    return *this;
  }